

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_opt.c
# Opt level: O3

int tnt_opt_init(tnt_opt *opt)

{
  uri *puVar1;
  
  opt->send_cb_arg = (void *)0x0;
  *(undefined8 *)&opt->send_buf = 0;
  (opt->tmout_connect).tv_sec = 0;
  (opt->tmout_connect).tv_usec = 0;
  opt->recv_cb = (void *)0x0;
  opt->recv_cb_arg = (void *)0x0;
  opt->send_cb = (void *)0x0;
  opt->send_cbv = (void *)0x0;
  (opt->tmout_send).tv_sec = 0;
  (opt->tmout_send).tv_usec = 0;
  (opt->tmout_recv).tv_sec = 0;
  (opt->tmout_recv).tv_usec = 0;
  opt->uristr = (char *)0x0;
  opt->uri = (uri *)0x0;
  *(undefined8 *)&opt->recv_buf = 0;
  opt->recv_buf = 0x4000;
  opt->send_buf = 0x4000;
  (opt->tmout_connect).tv_sec = 0x10;
  puVar1 = (uri *)tnt_mem_alloc(0x88);
  opt->uri = puVar1;
  return -(uint)(puVar1 == (uri *)0x0);
}

Assistant:

int
tnt_opt_init(struct tnt_opt *opt)
{
	memset(opt, 0, sizeof(struct tnt_opt));
	opt->recv_buf = 16384;
	opt->send_buf = 16384;
	opt->tmout_connect.tv_sec = 16;
	opt->tmout_connect.tv_usec = 0;
	opt->uri = tnt_mem_alloc(sizeof(struct uri));
	if (!opt->uri) return -1;
	return 0;
}